

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

uint32_t anon_unknown.dwarf_7e177::threadCount(void)

{
  ThreadPool *this;
  size_t sVar1;
  imageException *this_00;
  
  this = ThreadPoolMonoid::instance();
  sVar1 = ThreadPool::threadCount(this);
  if ((uint32_t)sVar1 != 0) {
    return (uint32_t)sVar1;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Thread Pool is not initialized.");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

uint32_t threadCount()
    {
        const uint32_t count = static_cast<uint32_t>(ThreadPoolMonoid::instance().threadCount());
        if( count == 0 )
            throw imageException( "Thread Pool is not initialized." );
        return count;
    }